

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfLong(MapFieldBase *this)

{
  ReflectionPayload *pRVar1;
  UntypedMapBase *pUVar2;
  undefined1 in_SIL;
  MutexLock lock;
  MutexLock local_10;
  
  pRVar1 = maybe_payload(this);
  if (pRVar1 == (ReflectionPayload *)0x0) {
    pUVar2 = (UntypedMapBase *)0x0;
  }
  else {
    local_10.mu_ = &pRVar1->mutex;
    absl::lts_20240722::Mutex::Lock();
    pUVar2 = (*(this->super_MapFieldBaseForParse).vtable_[9].get_map)
                       (&this->super_MapFieldBaseForParse,(bool)in_SIL);
    absl::lts_20240722::MutexLock::~MutexLock(&local_10);
  }
  return (size_t)pUVar2;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfLong() const {
  ConstAccess();
  size_t size = 0;
  if (auto* p = maybe_payload()) {
    {
      absl::MutexLock lock(&p->mutex);
      size = SpaceUsedExcludingSelfNoLock();
    }
    ConstAccess();
  }
  return size;
}